

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void patchlistaux(FuncState *fs,int list,int vtarget,int reg,int dtarget)

{
  int iVar1;
  int iVar2;
  int next;
  int dtarget_local;
  int reg_local;
  int vtarget_local;
  int list_local;
  FuncState *fs_local;
  
  reg_local = list;
  while (reg_local != -1) {
    iVar1 = getjump(fs,reg_local);
    iVar2 = patchtestreg(fs,reg_local,reg);
    if (iVar2 == 0) {
      fixjump(fs,reg_local,dtarget);
      reg_local = iVar1;
    }
    else {
      fixjump(fs,reg_local,vtarget);
      reg_local = iVar1;
    }
  }
  return;
}

Assistant:

static void patchlistaux (FuncState *fs, int list, int vtarget, int reg,
                          int dtarget) {
  while (list != NO_JUMP) {
    int next = getjump(fs, list);
    if (patchtestreg(fs, list, reg))
      fixjump(fs, list, vtarget);  /* Jump to target with value. */
    else
      fixjump(fs, list, dtarget);  /* jump to default target */
    list = next;
  }
}